

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

bool __thiscall
Assimp::glTF2Importer::CanRead(glTF2Importer *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  bool bVar2;
  string version;
  Asset asset;
  char *local_a70;
  long local_a68;
  char local_a60 [16];
  string local_a50;
  Asset local_a30;
  
  BaseImporter::GetExtension(&local_a50,pFile);
  iVar1 = std::__cxx11::string::compare((char *)&local_a50);
  if (iVar1 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      bVar2 = false;
      goto LAB_0067948c;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_a50);
    bVar2 = false;
    if ((pIOHandler == (IOSystem *)0x0) || (iVar1 != 0)) goto LAB_0067948c;
  }
  glTF2::Asset::Asset(&local_a30,pIOHandler);
  iVar1 = std::__cxx11::string::compare((char *)&local_a50);
  glTF2::Asset::Load(&local_a30,pFile,iVar1 == 0);
  local_a70 = local_a60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a70,local_a30.asset.version._M_dataplus._M_p,
             local_a30.asset.version._M_dataplus._M_p + local_a30.asset.version._M_string_length);
  if (local_a68 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = *local_a70 == '2';
  }
  if (local_a70 != local_a60) {
    operator_delete(local_a70);
  }
  glTF2::Asset::~Asset(&local_a30);
LAB_0067948c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
    operator_delete(local_a50._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool glTF2Importer::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const
{
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb")
        return false;

    if (pIOHandler) {
        glTF2::Asset asset(pIOHandler);
        asset.Load(pFile, extension == "glb");
        std::string version = asset.asset.version;
        return !version.empty() && version[0] == '2';
    }

    return false;
}